

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::struct_init(Parser *this)

{
  vector<ID_table_t,_std::allocator<ID_table_t>_> *this_00;
  vector<ID_table_t,_std::allocator<ID_table_t>_> *this_01;
  bool bVar1;
  lex_t lVar2;
  int iVar3;
  reference pvVar4;
  pointer pIVar5;
  size_type sVar6;
  void *this_02;
  pointer pLVar7;
  pointer this_03;
  ID *this_04;
  __normal_iterator<Lex_*,_std::vector<Lex,_std::allocator<Lex>_>_> local_38;
  iterator lex_end;
  iterator lex_ptr;
  iterator iStack_20;
  int table_index;
  iterator end;
  iterator ptr;
  Parser *this_local;
  
  pvVar4 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[](this->ID_tables_vec,0);
  end = ID_table_t::get_begin(pvVar4);
  pvVar4 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[](this->ID_tables_vec,0);
  iStack_20 = ID_table_t::get_end(pvVar4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffe0);
    if (!bVar1) break;
    pIVar5 = __gnu_cxx::__normal_iterator<ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator->
                       (&end);
    lVar2 = ID::get_type(pIVar5);
    if (lVar2 == LEX_STRUCT) {
      sVar6 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::size(this->ID_tables_vec);
      this_00 = this->ID_tables_vec;
      this_01 = this->ID_tables_vec;
      pIVar5 = __gnu_cxx::__normal_iterator<ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator->
                         (&end);
      iVar3 = ID::get_value(pIVar5);
      pvVar4 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[](this_01,(long)iVar3)
      ;
      std::vector<ID_table_t,_std::allocator<ID_table_t>_>::push_back(this_00,pvVar4);
      pIVar5 = __gnu_cxx::__normal_iterator<ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator->
                         (&end);
      ID::set_value(pIVar5,(int)sVar6);
    }
    __gnu_cxx::__normal_iterator<ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator++(&end);
  }
  if (DEBUG_MODE != 0) {
    this_02 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  }
  lex_end = std::vector<Lex,_std::allocator<Lex>_>::begin(this->lex_vec);
  local_38._M_current = (Lex *)std::vector<Lex,_std::allocator<Lex>_>::end(this->lex_vec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&lex_end,&local_38);
    if (!bVar1) break;
    pLVar7 = __gnu_cxx::__normal_iterator<Lex_*,_std::vector<Lex,_std::allocator<Lex>_>_>::
             operator->(&lex_end);
    iVar3 = Lex::get_add_value(pLVar7);
    if (iVar3 != 0) {
      pLVar7 = __gnu_cxx::__normal_iterator<Lex_*,_std::vector<Lex,_std::allocator<Lex>_>_>::
               operator->(&lex_end);
      pvVar4 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[]
                         (this->ID_tables_vec,0);
      this_03 = __gnu_cxx::__normal_iterator<Lex_*,_std::vector<Lex,_std::allocator<Lex>_>_>::
                operator->(&lex_end);
      iVar3 = Lex::get_add_value(this_03);
      this_04 = ID_table_t::operator[](pvVar4,iVar3);
      iVar3 = ID::get_value(this_04);
      Lex::set_add_value(pLVar7,iVar3);
    }
    __gnu_cxx::__normal_iterator<Lex_*,_std::vector<Lex,_std::allocator<Lex>_>_>::operator++
              (&lex_end);
  }
  return;
}

Assistant:

void Parser::struct_init() {
    auto ptr = ID_tables_vec[0].get_begin();
    auto end = ID_tables_vec[0].get_end();
    int table_index;

    while(ptr != end){
        if(ptr->get_type() == LEX_STRUCT){
            table_index = (int) ID_tables_vec.size();
            ID_tables_vec.push_back(ID_tables_vec[ptr->get_value()]);
            ptr->set_value(table_index);
        }
        ++ptr;
    }

    if (DEBUG_MODE)
        cout << endl << endl;
    auto lex_ptr = lex_vec.begin();
    auto lex_end = lex_vec.end();
    while(lex_ptr != lex_end){
        if(lex_ptr->get_add_value() != 0){
            lex_ptr->set_add_value(ID_tables_vec[0][lex_ptr->get_add_value()].get_value());
        }
        ++lex_ptr;
    }

}